

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O2

QString * __thiscall
ProjectGenerator::fixPathToQmake
          (QString *__return_storage_ptr__,ProjectGenerator *this,QString *file)

{
  bool bVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QLatin1StringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&file->d);
  qVar2 = QtPrivate::lengthHelperPointer<char>("/");
  local_30.m_data = "/";
  local_30.m_size = qVar2;
  bVar1 = operator!=(&Option::dir_sep,&local_30);
  if (bVar1) {
    QString::replace((QString *)__return_storage_ptr__,(QLatin1String *)&Option::dir_sep,
                     (CaseSensitivity)qVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectGenerator::fixPathToQmake(const QString &file)
{
    QString ret = file;
    if(Option::dir_sep != QLatin1String("/"))
        ret.replace(Option::dir_sep, QLatin1String("/"));
    return ret;
}